

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

int source_set_default_outcome(SOURCE_HANDLE source,AMQP_VALUE default_outcome_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  
  if (source == (SOURCE_HANDLE)0x0) {
    iVar2 = 0x3345;
  }
  else {
    iVar2 = 0x3355;
    if (default_outcome_value != (AMQP_VALUE)0x0) {
      item_value = amqpvalue_clone(default_outcome_value);
      if (item_value != (AMQP_VALUE)0x0) {
        iVar1 = amqpvalue_set_composite_item(source->composite_value,8,item_value);
        iVar2 = 0x335b;
        if (iVar1 == 0) {
          iVar2 = 0;
        }
        amqpvalue_destroy(item_value);
      }
    }
  }
  return iVar2;
}

Assistant:

int source_set_default_outcome(SOURCE_HANDLE source, AMQP_VALUE default_outcome_value)
{
    int result;

    if (source == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        SOURCE_INSTANCE* source_instance = (SOURCE_INSTANCE*)source;
        AMQP_VALUE default_outcome_amqp_value;
        if (default_outcome_value == NULL)
        {
            default_outcome_amqp_value = NULL;
        }
        else
        {
            default_outcome_amqp_value = amqpvalue_clone(default_outcome_value);
        }
        if (default_outcome_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(source_instance->composite_value, 8, default_outcome_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(default_outcome_amqp_value);
        }
    }

    return result;
}